

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_contains_range_closed
                (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  int iVar2;
  void **ppvVar3;
  uint8_t *puVar4;
  _Bool _Var5;
  ushort uVar6;
  int *piVar7;
  uint8_t uVar8;
  int iVar9;
  uint32_t range_end_00;
  uint16_t *puVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  if (range_end < range_start) {
LAB_0010b3c6:
    _Var5 = true;
  }
  else {
    if (range_start == range_end) {
      _Var5 = roaring_bitmap_contains(r,range_start);
      return _Var5;
    }
    iVar9 = (range_end >> 0x10) - (range_start >> 0x10);
    iVar2 = (r->high_low_container).size;
    if (iVar9 < iVar2) {
      if (iVar2 == 0) {
LAB_0010b414:
        uVar12 = iVar2 - 1;
LAB_0010b418:
        if (iVar2 != 0) {
          puVar10 = (r->high_low_container).keys;
          goto LAB_0010b421;
        }
LAB_0010b429:
        uVar13 = iVar2 - 1;
      }
      else {
        puVar10 = (r->high_low_container).keys;
        uVar6 = (ushort)(range_start >> 0x10);
        if (puVar10[(long)iVar2 + -1] == uVar6) goto LAB_0010b414;
        if (0 < iVar2) {
          iVar11 = iVar2 + -1;
          uVar13 = 0;
          do {
            uVar12 = iVar11 + uVar13 >> 1;
            uVar1 = *(ushort *)((long)puVar10 + (ulong)(iVar11 + uVar13 & 0xfffffffe));
            if (uVar1 < uVar6) {
              uVar13 = uVar12 + 1;
            }
            else {
              if (uVar1 <= uVar6) goto LAB_0010b418;
              iVar11 = uVar12 - 1;
            }
          } while ((int)uVar13 <= iVar11);
          uVar12 = ~uVar13;
          goto LAB_0010b418;
        }
        uVar12 = 0xffffffff;
LAB_0010b421:
        uVar6 = (ushort)(range_end >> 0x10);
        if (puVar10[(long)iVar2 + -1] == uVar6) goto LAB_0010b429;
        if (iVar2 < 1) {
          uVar13 = 0xffffffff;
        }
        else {
          iVar11 = iVar2 + -1;
          uVar14 = 0;
          do {
            uVar13 = iVar11 + uVar14 >> 1;
            uVar1 = *(ushort *)((long)puVar10 + (ulong)(iVar11 + uVar14 & 0xfffffffe));
            if (uVar1 < uVar6) {
              uVar14 = uVar13 + 1;
            }
            else {
              if (uVar1 <= uVar6) goto LAB_0010b42d;
              iVar11 = uVar13 - 1;
            }
          } while ((int)uVar14 <= iVar11);
          uVar13 = ~uVar14;
        }
      }
LAB_0010b42d:
      if (iVar2 <= (int)uVar13) {
        return false;
      }
      if ((int)uVar13 < 0) {
        return false;
      }
      if ((int)uVar12 < 0) {
        return false;
      }
      if (uVar13 - uVar12 != iVar9) {
        return false;
      }
      range_end_00 = (range_end & 0xffff) + 1;
      ppvVar3 = (r->high_low_container).containers;
      puVar4 = (r->high_low_container).typecodes;
      if (range_end >> 0x10 == range_start >> 0x10) {
        _Var5 = container_contains_range
                          (ppvVar3[uVar12 & 0xffff],range_start & 0xffff,range_end_00,
                           puVar4[uVar12 & 0xffff]);
        return _Var5;
      }
      _Var5 = container_contains_range
                        (ppvVar3[uVar12 & 0xffff],range_start & 0xffff,0x10000,
                         puVar4[uVar12 & 0xffff]);
      if (_Var5) {
        _Var5 = container_contains_range
                          (ppvVar3[uVar13 & 0xffff],0,range_end_00,puVar4[uVar13 & 0xffff]);
        if (!_Var5) {
          return false;
        }
        uVar12 = uVar12 + 1;
        if (uVar12 < uVar13) {
          do {
            uVar8 = puVar4[uVar12 & 0xffff];
            piVar7 = (int *)ppvVar3[uVar12 & 0xffff];
            if (uVar8 == '\x04') {
              uVar8 = (uint8_t)piVar7[2];
              piVar7 = *(int **)piVar7;
            }
            if (uVar8 == '\x03') {
              if (*piVar7 != 1) {
                return false;
              }
              if (**(short **)(piVar7 + 2) != 0) {
                return false;
              }
              if ((*(short **)(piVar7 + 2))[1] != -1) goto LAB_0010b5bb;
            }
            else if (*piVar7 != 0x10000) goto LAB_0010b5bb;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
        goto LAB_0010b3c6;
      }
    }
LAB_0010b5bb:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool roaring_bitmap_contains_range_closed(const roaring_bitmap_t *r,
                                          uint32_t range_start,
                                          uint32_t range_end) {
    if (range_start > range_end) {
        return true;
    }  // empty range are always contained!
    if (range_end == range_start) {
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    }
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)(range_end >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = (range_end & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}